

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.cpp
# Opt level: O2

void __thiscall
wasm::SuffixTreeTest_TestSingleRepetition_Test::TestBody
          (SuffixTreeTest_TestSingleRepetition_Test *this)

{
  uint *this_00;
  pointer *this_01;
  uint uVar1;
  uint *puVar2;
  long lVar3;
  uint *puVar4;
  char *pcVar5;
  initializer_list<unsigned_int> __l;
  RepeatedSubstringIterator local_250;
  undefined1 *puStack_208;
  SuffixTree ST;
  SuffixTreeInternalNode *local_120;
  undefined1 local_f8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> SimpleRepetitionData;
  undefined1 auStack_98 [8];
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  SubStrings;
  iterator It;
  
  puStack_208 = &DAT_200000001;
  _ST = &DAT_200000001;
  __l._M_len = 5;
  __l._M_array = (iterator)&puStack_208;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8,__l,
             (allocator_type *)
             &SubStrings.
              super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::wasm::SuffixTree::SuffixTree((SuffixTree *)&puStack_208,(vector *)local_f8);
  auStack_98 = (undefined1  [8])0x0;
  SubStrings.
  super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  SubStrings.
  super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  SuffixTree::RepeatedSubstringIterator::RepeatedSubstringIterator
            ((RepeatedSubstringIterator *)
             &SubStrings.
              super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_120);
  while( true ) {
    SimpleRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar3 = CONCAT71(SubStrings.
                     super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                     (char)SubStrings.
                           super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    SuffixTree::RepeatedSubstringIterator::~RepeatedSubstringIterator
              ((RepeatedSubstringIterator *)
               &SimpleRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (lVar3 == 0) break;
    std::
    vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
    ::push_back((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                 *)auStack_98,(value_type *)&It);
    SuffixTree::RepeatedSubstringIterator::operator++
              (&local_250,
               (RepeatedSubstringIterator *)
               &SubStrings.
                super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    SuffixTree::RepeatedSubstringIterator::~RepeatedSubstringIterator(&local_250);
  }
  SuffixTree::RepeatedSubstringIterator::~RepeatedSubstringIterator
            ((RepeatedSubstringIterator *)
             &SubStrings.
              super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  SimpleRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((long)SubStrings.
                       super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)auStack_98 >> 5);
  It.MinLength = 1;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)
             &SubStrings.
              super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"SubStrings.size()","1u",
             (unsigned_long *)
             &SimpleRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&It.MinLength);
  if ((char)SubStrings.
            super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
    testing::Message::Message
              ((Message *)
               &SimpleRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (It.N == (SuffixTreeNode *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)It.N;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&It.MinLength,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/suffix_tree.cpp"
               ,0x23,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&It.MinLength,
               (Message *)
               &SimpleRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&It.MinLength);
    if (SimpleRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      (**(code **)(*(long *)SimpleRepetitionData.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&It);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&It);
    SimpleRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(SimpleRepetitionData.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._4_4_,2);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)
               &SubStrings.
                super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"SubStrings[0].Length","2u",
               (uint *)auStack_98,
               (uint *)&SimpleRepetitionData.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if ((char)SubStrings.
              super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
      testing::Message::Message
                ((Message *)
                 &SimpleRepetitionData.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      if (It.N == (SuffixTreeNode *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)It.N;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&It.MinLength,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/suffix_tree.cpp"
                 ,0x24,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&It.MinLength,
                 (Message *)
                 &SimpleRepetitionData.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&It.MinLength);
      if (SimpleRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        (**(code **)(*(long *)SimpleRepetitionData.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&It);
    SimpleRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          ((long)auStack_98 + 8))->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          ((long)auStack_98 + 8))->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 2);
    It.MinLength = 2;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)
               &SubStrings.
                super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "SubStrings[0].StartIndices.size()","2u",
               (unsigned_long *)
               &SimpleRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&It.MinLength);
    if ((char)SubStrings.
              super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
      testing::Message::Message
                ((Message *)
                 &SimpleRepetitionData.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      if (It.N == (SuffixTreeNode *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)It.N;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&It.MinLength,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/suffix_tree.cpp"
                 ,0x25,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&It.MinLength,
                 (Message *)
                 &SimpleRepetitionData.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&It.MinLength);
      if (SimpleRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        (**(code **)(*(long *)SimpleRepetitionData.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&It);
    puVar2 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)auStack_98 + 8))->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    this_01 = &SimpleRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    this_00 = &It.MinLength;
    for (puVar4 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)auStack_98 + 8))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1) {
      uVar1 = *puVar4;
      SimpleRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT44(SimpleRepetitionData.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._4_4_,1);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)
                 &SubStrings.
                  super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 "SimpleRepetitionData[StartIdx]","1u",(uint *)((long)local_f8 + (ulong)uVar1 * 4),
                 (uint *)this_01);
      if ((char)SubStrings.
                super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
        testing::Message::Message((Message *)this_01);
        pcVar5 = "";
        if (It.N != (SuffixTreeNode *)0x0) {
          pcVar5 = *(char **)It.N;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)this_00,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/suffix_tree.cpp"
                   ,0x27,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)this_01);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
        if (SimpleRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          (**(code **)(*(long *)SimpleRepetitionData.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&It);
      SimpleRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT44(SimpleRepetitionData.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._4_4_,2);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)
                 &SubStrings.
                  super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 "SimpleRepetitionData[StartIdx + 1]","2u",
                 (uint *)((long)local_f8 + (ulong)(uVar1 + 1) * 4),(uint *)this_01);
      if ((char)SubStrings.
                super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
        testing::Message::Message((Message *)this_01);
        pcVar5 = "";
        if (It.N != (SuffixTreeNode *)0x0) {
          pcVar5 = *(char **)It.N;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)this_00,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/suffix_tree.cpp"
                   ,0x28,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)this_01);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
        if (SimpleRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          (**(code **)(*(long *)SimpleRepetitionData.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&It);
    }
  }
  std::
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ::~vector((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
             *)auStack_98);
  SuffixTree::~SuffixTree((SuffixTree *)&puStack_208);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
  return;
}

Assistant:

TEST(SuffixTreeTest, TestSingleRepetition) {
  std::vector<unsigned> SimpleRepetitionData = {1, 2, 1, 2, 3};
  SuffixTree ST(SimpleRepetitionData);
  std::vector<SuffixTree::RepeatedSubstring> SubStrings;
  for (auto It = ST.begin(); It != ST.end(); It++)
    SubStrings.push_back(*It);
  ASSERT_EQ(SubStrings.size(), 1u);
  EXPECT_EQ(SubStrings[0].Length, 2u);
  EXPECT_EQ(SubStrings[0].StartIndices.size(), 2u);
  for (unsigned StartIdx : SubStrings[0].StartIndices) {
    EXPECT_EQ(SimpleRepetitionData[StartIdx], 1u);
    EXPECT_EQ(SimpleRepetitionData[StartIdx + 1], 2u);
  }
}